

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

bool __thiscall ON_HatchLine::Write(ON_HatchLine *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar3 < 0x3c) {
    bVar1 = WriteV5(this,archive);
    return bVar1;
  }
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_angle_radians);
    if (((bVar1) && (bVar1 = ON_BinaryArchive::WritePoint(archive,&this->m_base), bVar1)) &&
       (bVar1 = ON_BinaryArchive::WriteVector(archive,&this->m_offset), bVar1)) {
      bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_dashes);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_HatchLine::Write(ON_BinaryArchive& archive) const
{
  if (archive.Archive3dmVersion() < 60)
    return WriteV5(archive);

  const int major_version = 1;
  const int minor_version = 0;
  if (!archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, major_version, minor_version))
    return false;
  bool rc = false;
  for (;;)
  {
    if (!archive.WriteDouble(m_angle_radians))
      break;
    if (!archive.WritePoint(m_base))
      break;
    if (!archive.WriteVector(m_offset))
      break;
    if (!archive.WriteArray(m_dashes))
      break;
    rc = true;
    break;
  }
  if (!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}